

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O2

int CheckInput(int *param_1)

{
  uint __i;
  long lVar1;
  timeval local_98;
  fd_set readfds;
  
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    readfds.fds_bits[lVar1] = 0;
  }
  readfds.fds_bits[0]._0_4_ = (uint)readfds.fds_bits[0] | 1;
  local_98.tv_sec = 0;
  local_98.tv_usec = 0;
  select(0x10,(fd_set *)&readfds,(fd_set *)0x0,(fd_set *)0x0,&local_98);
  return (uint)readfds.fds_bits[0] & 1;
}

Assistant:

int /* bool */ CheckInput(int &) {
    fd_set readfds;
    timeval tv;
    int /* bool */ data;
    FD_ZERO(&readfds);
    FD_SET(0, &readfds);
    tv.tv_sec = 0;
    tv.tv_usec = 0;
    select(16, &readfds, 0, 0, &tv);
    data = FD_ISSET(0, &readfds);
    return data;
}